

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int xml_parse_file_ext2(xar *xar,char *name)

{
  bool bVar1;
  int iVar2;
  xmlstatus xVar3;
  char *p;
  
  iVar2 = strcmp(name,"SecureDeletion");
  if (iVar2 == 0) {
    p = "securedeletion";
    xVar3 = FILE_EXT2_SecureDeletion;
  }
  else {
    iVar2 = strcmp(name,"Undelete");
    if (iVar2 == 0) {
      p = "nouunlink";
      xVar3 = FILE_EXT2_Undelete;
    }
    else {
      iVar2 = strcmp(name,"Compress");
      if (iVar2 == 0) {
        p = "compress";
        xVar3 = FILE_EXT2_Compress;
      }
      else {
        iVar2 = strcmp(name,"Synchronous");
        if (iVar2 == 0) {
          p = "sync";
          xVar3 = FILE_EXT2_Synchronous;
        }
        else {
          iVar2 = strcmp(name,"Immutable");
          if (iVar2 == 0) {
            p = "simmutable";
            xVar3 = FILE_EXT2_Immutable;
          }
          else {
            iVar2 = strcmp(name,"AppendOnly");
            if (iVar2 == 0) {
              p = "sappend";
              xVar3 = FILE_EXT2_AppendOnly;
            }
            else {
              iVar2 = strcmp(name,"NoDump");
              if (iVar2 == 0) {
                p = "nodump";
                xVar3 = FILE_EXT2_NoDump;
              }
              else {
                iVar2 = strcmp(name,"NoAtime");
                if (iVar2 == 0) {
                  p = "noatime";
                  xVar3 = FILE_EXT2_NoAtime;
                }
                else {
                  iVar2 = strcmp(name,"CompDirty");
                  if (iVar2 == 0) {
                    p = "compdirty";
                    xVar3 = FILE_EXT2_CompDirty;
                  }
                  else {
                    iVar2 = strcmp(name,"CompBlock");
                    if (iVar2 == 0) {
                      p = "comprblk";
                      xVar3 = FILE_EXT2_CompBlock;
                    }
                    else {
                      iVar2 = strcmp(name,"NoCompBlock");
                      if (iVar2 == 0) {
                        p = "nocomprblk";
                        xVar3 = FILE_EXT2_NoCompBlock;
                      }
                      else {
                        iVar2 = strcmp(name,"CompError");
                        if (iVar2 == 0) {
                          p = "comperr";
                          xVar3 = FILE_EXT2_CompError;
                        }
                        else {
                          iVar2 = strcmp(name,"BTree");
                          if (iVar2 == 0) {
                            p = "btree";
                            xVar3 = FILE_EXT2_BTree;
                          }
                          else {
                            iVar2 = strcmp(name,"HashIndexed");
                            if (iVar2 == 0) {
                              p = "hashidx";
                              xVar3 = FILE_EXT2_HashIndexed;
                            }
                            else {
                              iVar2 = strcmp(name,"iMagic");
                              if (iVar2 == 0) {
                                p = "imagic";
                                xVar3 = FILE_EXT2_iMagic;
                              }
                              else {
                                iVar2 = strcmp(name,"Journaled");
                                if (iVar2 == 0) {
                                  p = "journal";
                                  xVar3 = FILE_EXT2_Journaled;
                                }
                                else {
                                  iVar2 = strcmp(name,"NoTail");
                                  if (iVar2 == 0) {
                                    p = "notail";
                                    xVar3 = FILE_EXT2_NoTail;
                                  }
                                  else {
                                    iVar2 = strcmp(name,"DirSync");
                                    if (iVar2 == 0) {
                                      p = "dirsync";
                                      xVar3 = FILE_EXT2_DirSync;
                                    }
                                    else {
                                      iVar2 = strcmp(name,"TopDir");
                                      if (iVar2 == 0) {
                                        p = "topdir";
                                        xVar3 = FILE_EXT2_TopDir;
                                      }
                                      else {
                                        iVar2 = strcmp(name,"Reserved");
                                        if (iVar2 != 0) {
                                          bVar1 = true;
                                          p = (char *)0x0;
                                          goto LAB_00139749;
                                        }
                                        p = "reserved";
                                        xVar3 = FILE_EXT2_Reserved;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  xar->xmlsts = xVar3;
  bVar1 = false;
LAB_00139749:
  iVar2 = 0;
  if (!bVar1) {
    if ((xar->file->fflags_text).length != 0) {
      archive_strappend_char(&xar->file->fflags_text,',');
    }
    archive_strcat(&xar->file->fflags_text,p);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
xml_parse_file_ext2(struct xar *xar, const char *name)
{
	const char *flag = NULL;

	if (strcmp(name, "SecureDeletion") == 0) {
		xar->xmlsts = FILE_EXT2_SecureDeletion;
		flag = "securedeletion";
	}
	else if (strcmp(name, "Undelete") == 0) {
		xar->xmlsts = FILE_EXT2_Undelete;
		flag = "nouunlink";
	}
	else if (strcmp(name, "Compress") == 0) {
		xar->xmlsts = FILE_EXT2_Compress;
		flag = "compress";
	}
	else if (strcmp(name, "Synchronous") == 0) {
		xar->xmlsts = FILE_EXT2_Synchronous;
		flag = "sync";
	}
	else if (strcmp(name, "Immutable") == 0) {
		xar->xmlsts = FILE_EXT2_Immutable;
		flag = "simmutable";
	}
	else if (strcmp(name, "AppendOnly") == 0) {
		xar->xmlsts = FILE_EXT2_AppendOnly;
		flag = "sappend";
	}
	else if (strcmp(name, "NoDump") == 0) {
		xar->xmlsts = FILE_EXT2_NoDump;
		flag = "nodump";
	}
	else if (strcmp(name, "NoAtime") == 0) {
		xar->xmlsts = FILE_EXT2_NoAtime;
		flag = "noatime";
	}
	else if (strcmp(name, "CompDirty") == 0) {
		xar->xmlsts = FILE_EXT2_CompDirty;
		flag = "compdirty";
	}
	else if (strcmp(name, "CompBlock") == 0) {
		xar->xmlsts = FILE_EXT2_CompBlock;
		flag = "comprblk";
	}
	else if (strcmp(name, "NoCompBlock") == 0) {
		xar->xmlsts = FILE_EXT2_NoCompBlock;
		flag = "nocomprblk";
	}
	else if (strcmp(name, "CompError") == 0) {
		xar->xmlsts = FILE_EXT2_CompError;
		flag = "comperr";
	}
	else if (strcmp(name, "BTree") == 0) {
		xar->xmlsts = FILE_EXT2_BTree;
		flag = "btree";
	}
	else if (strcmp(name, "HashIndexed") == 0) {
		xar->xmlsts = FILE_EXT2_HashIndexed;
		flag = "hashidx";
	}
	else if (strcmp(name, "iMagic") == 0) {
		xar->xmlsts = FILE_EXT2_iMagic;
		flag = "imagic";
	}
	else if (strcmp(name, "Journaled") == 0) {
		xar->xmlsts = FILE_EXT2_Journaled;
		flag = "journal";
	}
	else if (strcmp(name, "NoTail") == 0) {
		xar->xmlsts = FILE_EXT2_NoTail;
		flag = "notail";
	}
	else if (strcmp(name, "DirSync") == 0) {
		xar->xmlsts = FILE_EXT2_DirSync;
		flag = "dirsync";
	}
	else if (strcmp(name, "TopDir") == 0) {
		xar->xmlsts = FILE_EXT2_TopDir;
		flag = "topdir";
	}
	else if (strcmp(name, "Reserved") == 0) {
		xar->xmlsts = FILE_EXT2_Reserved;
		flag = "reserved";
	}

	if (flag == NULL)
		return (0);
	if (archive_strlen(&(xar->file->fflags_text)) > 0)
		archive_strappend_char(&(xar->file->fflags_text), ',');
	archive_strcat(&(xar->file->fflags_text), flag);
	return (1);
}